

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffgkyt(fitsfile *fptr,char *keyname,long *ivalue,double *fraction,char *comm,int *status)

{
  double dVar1;
  long lVar2;
  char *cval;
  char *pcVar3;
  char valstring [71];
  char acStack_68 [72];
  
  if (0 < *status) {
    return *status;
  }
  ffgkey(fptr,keyname,acStack_68,comm,status);
  ffc2d(acStack_68,fraction,status);
  dVar1 = *fraction;
  lVar2 = (long)dVar1;
  *ivalue = lVar2;
  *fraction = dVar1 - (double)lVar2;
  cval = strchr(acStack_68,0x2e);
  if (cval != (char *)0x0) {
    pcVar3 = strchr(acStack_68,0x45);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strchr(acStack_68,0x44);
      if (pcVar3 == (char *)0x0) {
        ffc2d(cval,fraction,status);
      }
    }
  }
  return *status;
}

Assistant:

int ffgkyt( fitsfile *fptr,      /* I - FITS file pointer                 */
            const char   *keyname,     /* I - name of keyword to read           */
            long   *ivalue,      /* O - integer part of keyword value     */
            double *fraction,    /* O - fractional part of keyword value  */
            char   *comm,        /* O - keyword comment                   */
            int    *status)      /* IO - error status                     */
/*
  Read (get) the named keyword, returning the value and comment.
  The integer and fractional parts of the value are returned in separate
  variables, to allow more numerical precision to be passed.  This
  effectively passes a 'triple' precision value, with a 4-byte integer
  and an 8-byte fraction.  The comment may be up to 69 characters long.
*/
{
    char valstring[FLEN_VALUE];
    char *loc;

    if (*status > 0)
        return(*status);

    ffgkey(fptr, keyname, valstring, comm, status);  /* read the keyword */

    /*  read the entire value string as a double, to get the integer part */
    ffc2d(valstring, fraction, status);

    *ivalue = (long) *fraction;

    *fraction = *fraction - *ivalue;

    /* see if we need to read the fractional part again with more precision */
    /* look for decimal point, without an exponential E or D character */

    loc = strchr(valstring, '.');
    if (loc)
    {
        if (!strchr(valstring, 'E') && !strchr(valstring, 'D'))
            ffc2d(loc, fraction, status);
    }

    return(*status);
}